

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O0

void set_es_to_vdpp2_reg(vdpp2_params *src_params,vdpp2_reg *dst_reg)

{
  uint uVar1;
  RK_S32 RVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int local_54;
  double y1;
  double y0;
  double x1;
  double x0;
  RK_S32 i;
  byte bStack_24;
  byte bStack_23;
  byte bStack_22;
  RK_U8 conf_local_mean_th;
  RK_U8 diff2conf_lut_k [8];
  EsParams *p_es_param;
  vdpp2_reg *dst_reg_local;
  vdpp2_params *src_params_local;
  
  diff2conf_lut_k = (RK_U8  [8])&src_params->es_params;
  _i = 0;
  uVar1 = mpp_clip((int)(((float)(src_params->es_params).es_iWgtLocalTh * 256.0) /
                        (float)(src_params->es_params).es_iWgtGain),0,0xff);
  update_es_tan((EsParams *)diff2conf_lut_k);
  *(byte *)&(dst_reg->es).reg0 =
       *(byte *)&(dst_reg->es).reg0 & 0xfe | (byte)*(undefined4 *)diff2conf_lut_k & 1;
  *(ushort *)&(dst_reg->es).reg1 =
       *(ushort *)&(dst_reg->es).reg1 & 0xff |
       (short)*(undefined4 *)((long)diff2conf_lut_k + 0xc) << 8;
  *(ushort *)&(dst_reg->es).reg1 =
       *(ushort *)&(dst_reg->es).reg1 & 0xff00 |
       (ushort)*(undefined4 *)((long)diff2conf_lut_k + 0x10) & 0xff;
  (dst_reg->es).reg2 =
       (anon_struct_4_3_30fecd47_for_reg2)
       ((uint)(dst_reg->es).reg2 & 0xfe00ffff |
       (*(uint *)((long)diff2conf_lut_k + 0x88) & 0x1ff) << 0x10);
  (dst_reg->es).reg2 =
       (anon_struct_4_3_30fecd47_for_reg2)
       ((uint)(dst_reg->es).reg2 & 0xfffffe00 | *(uint *)((long)diff2conf_lut_k + 0x84) & 0x1ff);
  *(ushort *)&(dst_reg->es).reg3 =
       *(ushort *)&(dst_reg->es).reg3 & 0xfffe |
       (ushort)*(undefined4 *)((long)diff2conf_lut_k + 0x80) & 1;
  (dst_reg->es).reg4 =
       (anon_struct_4_2_34aad9ab_for_reg4)
       ((uint)(dst_reg->es).reg4 & 0xffff0000 | *(uint *)((long)diff2conf_lut_k + 0x2c) & 0xffff);
  (dst_reg->es).reg4 =
       (anon_struct_4_2_34aad9ab_for_reg4)
       ((uint)(dst_reg->es).reg4 & 0xffff | *(int *)((long)diff2conf_lut_k + 0x34) << 0x10);
  (dst_reg->es).reg5 =
       (anon_struct_4_2_9ad3edb5_for_reg5)
       ((uint)(dst_reg->es).reg5 & 0xffff | *(int *)((long)diff2conf_lut_k + 0x30) << 0x10);
  (dst_reg->es).reg5 =
       (anon_struct_4_2_9ad3edb5_for_reg5)
       ((uint)(dst_reg->es).reg5 & 0xffff0000 | *(uint *)((long)diff2conf_lut_k + 0x38) & 0xffff);
  (dst_reg->es).reg6 =
       (anon_struct_4_2_02c81542_for_reg6)
       ((uint)(dst_reg->es).reg6 & 0xffff | *(int *)((long)diff2conf_lut_k + 0x3c) << 0x10);
  (dst_reg->es).reg6 =
       (anon_struct_4_2_02c81542_for_reg6)
       ((uint)(dst_reg->es).reg6 & 0xffff0000 | *(uint *)((long)diff2conf_lut_k + 0x40) & 0xffff);
  (dst_reg->es).reg7 =
       (anon_struct_4_2_02c81582_for_reg7)
       ((uint)(dst_reg->es).reg7 & 0xffff | *(int *)((long)diff2conf_lut_k + 0x44) << 0x10);
  (dst_reg->es).reg7 =
       (anon_struct_4_2_02c81582_for_reg7)
       ((uint)(dst_reg->es).reg7 & 0xffff0000 | *(uint *)((long)diff2conf_lut_k + 0x48) & 0xffff);
  (dst_reg->es).reg8 =
       (anon_struct_4_2_02c815c2_for_reg8)
       ((uint)(dst_reg->es).reg8 & 0xffff | *(int *)((long)diff2conf_lut_k + 0x4c) << 0x10);
  (dst_reg->es).reg8 =
       (anon_struct_4_2_02c815c2_for_reg8)
       ((uint)(dst_reg->es).reg8 & 0xffff0000 | *(uint *)((long)diff2conf_lut_k + 0x50) & 0xffff);
  (dst_reg->es).reg9 =
       (anon_struct_4_2_02c81602_for_reg9)
       ((uint)(dst_reg->es).reg9 & 0xffff | *(int *)((long)diff2conf_lut_k + 0x54) << 0x10);
  (dst_reg->es).reg9 =
       (anon_struct_4_2_02c81602_for_reg9)
       ((uint)(dst_reg->es).reg9 & 0xffff0000 | *(uint *)((long)diff2conf_lut_k + 0x58) & 0xffff);
  (dst_reg->es).reg10 =
       (anon_struct_4_4_73edf603_for_reg10)
       ((uint)(dst_reg->es).reg10 & 0xffffff00 | *(uint *)((long)diff2conf_lut_k + 0x5c) & 0xff);
  (dst_reg->es).reg10 =
       (anon_struct_4_4_73edf603_for_reg10)
       ((uint)(dst_reg->es).reg10 & 0xffff00ff |
       (*(uint *)((long)diff2conf_lut_k + 0x60) & 0xff) << 8);
  (dst_reg->es).reg10 =
       (anon_struct_4_4_73edf603_for_reg10)
       ((uint)(dst_reg->es).reg10 & 0xff00ffff |
       (*(uint *)((long)diff2conf_lut_k + 100) & 0xff) << 0x10);
  (dst_reg->es).reg10 =
       (anon_struct_4_4_73edf603_for_reg10)
       ((uint)(dst_reg->es).reg10 & 0xffffff | *(int *)((long)diff2conf_lut_k + 0x68) << 0x18);
  (dst_reg->es).reg11 =
       (anon_struct_4_4_73efd703_for_reg11)
       ((uint)(dst_reg->es).reg11 & 0xffffff00 | *(uint *)((long)diff2conf_lut_k + 0x6c) & 0xff);
  (dst_reg->es).reg11 =
       (anon_struct_4_4_73efd703_for_reg11)
       ((uint)(dst_reg->es).reg11 & 0xffff00ff |
       (*(uint *)((long)diff2conf_lut_k + 0x70) & 0xff) << 8);
  (dst_reg->es).reg11 =
       (anon_struct_4_4_73efd703_for_reg11)
       ((uint)(dst_reg->es).reg11 & 0xff00ffff |
       (*(uint *)((long)diff2conf_lut_k + 0x74) & 0xff) << 0x10);
  (dst_reg->es).reg11 =
       (anon_struct_4_4_73efd703_for_reg11)
       ((uint)(dst_reg->es).reg11 & 0xffffff | *(int *)((long)diff2conf_lut_k + 0x78) << 0x18);
  *(char *)&(dst_reg->es).reg12 = (char)*(undefined4 *)((long)diff2conf_lut_k + 0x7c);
  for (x0._0_4_ = 0; x0._0_4_ < 8; x0._0_4_ = x0._0_4_ + 1) {
    dVar3 = (double)*(uint *)((long)diff2conf_lut_k + 0x38 + (long)x0._0_4_ * 4);
    dVar4 = (double)*(uint *)((long)diff2conf_lut_k + 0x3c + (long)x0._0_4_ * 4);
    dVar5 = (double)*(uint *)((long)diff2conf_lut_k + 0x5c + (long)x0._0_4_ * 4);
    dVar6 = (double)*(uint *)((long)diff2conf_lut_k + 0x60 + (long)x0._0_4_ * 4);
    if ((double)(int)(((dVar6 - dVar5) * 256.0) / (dVar4 - dVar3)) <=
        ((dVar6 - dVar5) * 256.0) / (dVar4 - dVar3)) {
      dVar3 = ((dVar6 - dVar5) * 256.0) / (dVar4 - dVar3);
    }
    else {
      dVar3 = ((dVar6 - dVar5) * 256.0) / (dVar4 - dVar3) - 1.0;
    }
    local_54 = (int)dVar3;
    RVar2 = mpp_clip(local_54,0,0xff);
    *(char *)((long)&i + (long)x0._0_4_) = (char)RVar2;
  }
  (dst_reg->es).reg13 =
       (anon_struct_4_4_73221983_for_reg13)((uint)(dst_reg->es).reg13 & 0xffffff00 | (uint)(byte)i);
  (dst_reg->es).reg13 =
       (anon_struct_4_4_73221983_for_reg13)
       ((uint)(dst_reg->es).reg13 & 0xffff00ff | (uint)i._1_1_ << 8);
  (dst_reg->es).reg13 =
       (anon_struct_4_4_73221983_for_reg13)
       ((uint)(dst_reg->es).reg13 & 0xff00ffff | (uint)i._2_1_ << 0x10);
  (dst_reg->es).reg13 =
       (anon_struct_4_4_73221983_for_reg13)
       ((uint)(dst_reg->es).reg13 & 0xffffff | (uint)i._3_1_ << 0x18);
  (dst_reg->es).reg14 =
       (anon_struct_4_4_7323fa83_for_reg14)
       ((uint)(dst_reg->es).reg14 & 0xffffff00 | (uint)bStack_24);
  (dst_reg->es).reg14 =
       (anon_struct_4_4_7323fa83_for_reg14)
       ((uint)(dst_reg->es).reg14 & 0xffff00ff | (uint)bStack_23 << 8);
  (dst_reg->es).reg14 =
       (anon_struct_4_4_7323fa83_for_reg14)
       ((uint)(dst_reg->es).reg14 & 0xff00ffff | (uint)bStack_22 << 0x10);
  (dst_reg->es).reg14 =
       (anon_struct_4_4_7323fa83_for_reg14)
       ((uint)(dst_reg->es).reg14 & 0xffffff | (uint)conf_local_mean_th << 0x18);
  *(ushort *)&(dst_reg->es).reg15 =
       *(ushort *)&(dst_reg->es).reg15 & 0xff00 |
       (ushort)*(undefined4 *)((long)diff2conf_lut_k + 0x18) & 0xff;
  *(ushort *)&(dst_reg->es).reg15 =
       *(ushort *)&(dst_reg->es).reg15 & 0xff |
       (short)*(undefined4 *)((long)diff2conf_lut_k + 0x14) << 8;
  (dst_reg->es).reg16 =
       (anon_struct_4_5_566da832_for_reg16)((uint)(dst_reg->es).reg16 & 0xffffff00 | uVar1 & 0xff);
  (dst_reg->es).reg16 =
       (anon_struct_4_5_566da832_for_reg16)
       ((uint)(dst_reg->es).reg16 & 0xfffff0ff |
       (*(uint *)((long)diff2conf_lut_k + 0x24) & 0xf) << 8);
  (dst_reg->es).reg16 =
       (anon_struct_4_5_566da832_for_reg16)
       ((uint)(dst_reg->es).reg16 & 0xffffff | *(int *)((long)diff2conf_lut_k + 0x1c) << 0x18);
  (dst_reg->es).reg16 =
       (anon_struct_4_5_566da832_for_reg16)
       ((uint)(dst_reg->es).reg16 & 0xff00ffff |
       (*(uint *)((long)diff2conf_lut_k + 0x20) & 0xff) << 0x10);
  return;
}

Assistant:

static void set_es_to_vdpp2_reg(struct vdpp2_params* src_params, struct vdpp2_reg* dst_reg)
{
    EsParams *p_es_param = &src_params->es_params;
    RK_U8 diff2conf_lut_k[8] = { 0 };
    RK_U8 conf_local_mean_th = mpp_clip((256 * (float)p_es_param->es_iWgtLocalTh)
                                        / p_es_param->es_iWgtGain, 0, 255);
    RK_S32 i;

    update_es_tan(p_es_param);

    dst_reg->es.reg0.es_enable = p_es_param->es_bEnabledES;
    dst_reg->es.reg1.dir_th    = p_es_param->es_iGradNoDirTh;
    dst_reg->es.reg1.flat_th   = p_es_param->es_iGradFlatTh;

    dst_reg->es.reg2.tan_lo_th = p_es_param->es_tan_lo_th;
    dst_reg->es.reg2.tan_hi_th = p_es_param->es_tan_hi_th;

    dst_reg->es.reg3.ep_chk_en = p_es_param->es_bEndpointCheckEnable;
    //dst_reg->es.sw_dir_chk.MEM_GAT_EN

    dst_reg->es.reg4.diff_gain0 = p_es_param->es_iK1;
    dst_reg->es.reg4.diff_limit = p_es_param->es_iDeltaLimit;

    dst_reg->es.reg5.diff_gain1 = p_es_param->es_iK2;
    dst_reg->es.reg5.lut_x0     = p_es_param->es_iDiff2conf_lut_x[0];

    dst_reg->es.reg6.lut_x1    = p_es_param->es_iDiff2conf_lut_x[1];
    dst_reg->es.reg6.lut_x2    = p_es_param->es_iDiff2conf_lut_x[2];
    dst_reg->es.reg7.lut_x3    = p_es_param->es_iDiff2conf_lut_x[3];
    dst_reg->es.reg7.lut_x4    = p_es_param->es_iDiff2conf_lut_x[4];
    dst_reg->es.reg8.lut_x5    = p_es_param->es_iDiff2conf_lut_x[5];
    dst_reg->es.reg8.lut_x6    = p_es_param->es_iDiff2conf_lut_x[6];
    dst_reg->es.reg9.lut_x7    = p_es_param->es_iDiff2conf_lut_x[7];
    dst_reg->es.reg9.lut_x8    = p_es_param->es_iDiff2conf_lut_x[8];

    dst_reg->es.reg10.lut_y0    = p_es_param->es_iDiff2conf_lut_y[0];
    dst_reg->es.reg10.lut_y1    = p_es_param->es_iDiff2conf_lut_y[1];
    dst_reg->es.reg10.lut_y2    = p_es_param->es_iDiff2conf_lut_y[2];
    dst_reg->es.reg10.lut_y3    = p_es_param->es_iDiff2conf_lut_y[3];
    dst_reg->es.reg11.lut_y4    = p_es_param->es_iDiff2conf_lut_y[4];
    dst_reg->es.reg11.lut_y5    = p_es_param->es_iDiff2conf_lut_y[5];
    dst_reg->es.reg11.lut_y6    = p_es_param->es_iDiff2conf_lut_y[6];
    dst_reg->es.reg11.lut_y7    = p_es_param->es_iDiff2conf_lut_y[7];
    dst_reg->es.reg12.lut_y8    = p_es_param->es_iDiff2conf_lut_y[8];

    for (i = 0; i < 8; i++) {
        double x0 = p_es_param->es_iDiff2conf_lut_x[i];
        double x1 = p_es_param->es_iDiff2conf_lut_x[i + 1];
        double y0 = p_es_param->es_iDiff2conf_lut_y[i];
        double y1 = p_es_param->es_iDiff2conf_lut_y[i + 1];
        diff2conf_lut_k[i] = mpp_clip(FLOOR(256 * (y1 - y0) / (x1 - x0)), 0, 255);
    }
    dst_reg->es.reg13.lut_k0 = diff2conf_lut_k[0];
    dst_reg->es.reg13.lut_k1 = diff2conf_lut_k[1];
    dst_reg->es.reg13.lut_k2 = diff2conf_lut_k[2];
    dst_reg->es.reg13.lut_k3 = diff2conf_lut_k[3];
    dst_reg->es.reg14.lut_k4 = diff2conf_lut_k[4];
    dst_reg->es.reg14.lut_k5 = diff2conf_lut_k[5];
    dst_reg->es.reg14.lut_k6 = diff2conf_lut_k[6];
    dst_reg->es.reg14.lut_k7 = diff2conf_lut_k[7];

    dst_reg->es.reg15.wgt_decay = p_es_param->es_iWgtDecay;
    dst_reg->es.reg15.wgt_gain  = p_es_param->es_iWgtGain;

    dst_reg->es.reg16.conf_mean_th    = conf_local_mean_th;
    dst_reg->es.reg16.conf_cnt_th     = p_es_param->es_iConfCntTh;
    dst_reg->es.reg16.low_conf_th     = p_es_param->es_iLowConfTh;
    dst_reg->es.reg16.low_conf_ratio  = p_es_param->es_iLowConfRatio;
}